

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::append_move(xml_node *this,xml_node *moved)

{
  bool bVar1;
  xml_document_struct *pxVar2;
  xml_node xVar3;
  
  xVar3 = (xml_node)this->_root;
  bVar1 = impl::anon_unknown_0::allow_move(xVar3,(xml_node)moved->_root);
  if (bVar1) {
    impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(xVar3._root);
    pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(this->_root);
    *(byte *)&(pxVar2->super_xml_node_struct).header =
         (byte)(pxVar2->super_xml_node_struct).header | 0x40;
    impl::anon_unknown_0::remove_node(moved->_root);
    impl::anon_unknown_0::append_node(moved->_root,this->_root);
    xVar3 = (xml_node)moved->_root;
  }
  else {
    xVar3._root = (xml_node_struct *)0x0;
  }
  return (xml_node)xVar3._root;
}

Assistant:

PUGI__FN xml_node xml_node::append_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::append_node(moved._root, _root);

		return moved;
	}